

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O3

int LS_ChangeCamera(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4
                   )

{
  AActor *pAVar1;
  player_t *ppVar2;
  AActor *pAVar3;
  int i;
  long lVar4;
  AActor *actor;
  long *plVar5;
  
  if (arg0 != 0) {
    for (pAVar3 = AActor::TIDHash[arg0 & 0x7f]; pAVar3 != (AActor *)0x0; pAVar3 = pAVar3->inext) {
      if (pAVar3->tid == arg0) goto LAB_004088b9;
    }
  }
  pAVar3 = (AActor *)0x0;
LAB_004088b9:
  if ((it == (AActor *)0x0) || (ppVar2 = it->player, arg1 != 0 || ppVar2 == (player_t *)0x0)) {
    plVar5 = &DAT_017e1fb8;
    lVar4 = 0;
    do {
      if (playeringame[lVar4] == true) {
        pAVar1 = (AActor *)*plVar5;
        if (pAVar1 == (AActor *)0x0) {
          pAVar1 = (AActor *)0x0;
        }
        else if (((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
          pAVar1 = (AActor *)0x0;
        }
        if (pAVar3 == (AActor *)0x0) {
          actor = (AActor *)plVar5[-0x2f];
          *plVar5 = (long)actor;
          *(byte *)(plVar5 + -0x12) = *(byte *)(plVar5 + -0x12) & 0x7f;
          if (actor != (AActor *)0x0) goto LAB_00408941;
LAB_0040894e:
          actor = (AActor *)0x0;
        }
        else {
          *plVar5 = (long)pAVar3;
          actor = pAVar3;
          if (arg2 != 0) {
            *(byte *)(plVar5 + -0x12) = *(byte *)(plVar5 + -0x12) | 0x80;
          }
LAB_00408941:
          if (((actor->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
            *plVar5 = 0;
            goto LAB_0040894e;
          }
        }
        if (pAVar1 != actor) {
          if (actor == (AActor *)0x0) {
LAB_00408967:
            actor = (AActor *)0x0;
          }
          else if (((actor->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
            *plVar5 = 0;
            goto LAB_00408967;
          }
          R_ClearPastViewer(actor);
        }
      }
      lVar4 = lVar4 + 1;
      plVar5 = plVar5 + 0x54;
      if (lVar4 == 8) {
        return 1;
      }
    } while( true );
  }
  pAVar1 = (ppVar2->camera).field_0.p;
  if (pAVar1 == (AActor *)0x0) {
LAB_004089a4:
    pAVar1 = (AActor *)0x0;
  }
  else if (((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (ppVar2->camera).field_0.p = (AActor *)0x0;
    goto LAB_004089a4;
  }
  if (pAVar3 == (AActor *)0x0) {
    (it->player->camera).field_0.p = it;
    ppVar2 = it->player;
    ppVar2->cheats = ppVar2->cheats & 0xffffff7f;
  }
  else {
    (it->player->camera).field_0.p = pAVar3;
    ppVar2 = it->player;
    if (arg2 != 0) {
      *(byte *)&ppVar2->cheats = (byte)ppVar2->cheats | 0x80;
    }
  }
  pAVar3 = (ppVar2->camera).field_0.p;
  if (pAVar3 == (AActor *)0x0) {
LAB_00408a02:
    pAVar3 = (AActor *)0x0;
  }
  else if (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (ppVar2->camera).field_0.p = (AActor *)0x0;
    goto LAB_00408a02;
  }
  if (pAVar1 == pAVar3) {
    return 1;
  }
  pAVar3 = (it->player->camera).field_0.p;
  if (pAVar3 != (AActor *)0x0) {
    if (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_00408a2f;
    (it->player->camera).field_0.p = (AActor *)0x0;
  }
  pAVar3 = (AActor *)0x0;
LAB_00408a2f:
  R_ClearPastViewer(pAVar3);
  return 1;
}

Assistant:

FUNC(LS_ChangeCamera)
// ChangeCamera (tid, who, revert?)
{
	AActor *camera;
	if (arg0 != 0)
	{
		FActorIterator iterator (arg0);
		camera = iterator.Next ();
	}
	else
	{
		camera = NULL;
	}

	if (!it || !it->player || arg1)
	{
		int i;

		for (i = 0; i < MAXPLAYERS; i++)
		{
			if (!playeringame[i])
				continue;

			AActor *oldcamera = players[i].camera;
			if (camera)
			{
				players[i].camera = camera;
				if (arg2)
					players[i].cheats |= CF_REVERTPLEASE;
			}
			else
			{
				players[i].camera = players[i].mo;
				players[i].cheats &= ~CF_REVERTPLEASE;
			}
			if (oldcamera != players[i].camera)
			{
				R_ClearPastViewer (players[i].camera);
			}
		}
	}
	else
	{
		AActor *oldcamera = it->player->camera;
		if (camera)
		{
			it->player->camera = camera;
			if (arg2)
				it->player->cheats |= CF_REVERTPLEASE;
		}
		else
		{
			it->player->camera = it;
			it->player->cheats &= ~CF_REVERTPLEASE;
		}
		if (oldcamera != it->player->camera)
		{
			R_ClearPastViewer (it->player->camera);
		}
	}

	return true;
}